

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

quicly_stream_t *
open_stream(quicly_conn_t *conn,uint64_t stream_id,uint32_t initial_max_stream_data_local,
           uint64_t initial_max_stream_data_remote)

{
  undefined1 *puVar1;
  anon_struct_32_2_6d702f80_for_pending_link *paVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  kh_quicly_stream_t_t *h;
  khint32_t *pkVar5;
  quicly_context_t *pqVar6;
  int iVar7;
  uint32_t uVar8;
  quicly_stream_t *pqVar9;
  quicly_linklist_t *pqVar10;
  sbyte sVar11;
  byte bVar12;
  uint uVar13;
  khint_t kVar14;
  uint uVar15;
  khint_t kVar16;
  uint uVar17;
  khint_t kVar18;
  uint uVar19;
  _st_quicly_conn_public_t *c;
  bool bVar20;
  bool bVar21;
  
  pqVar9 = (quicly_stream_t *)malloc(0x128);
  if (pqVar9 == (quicly_stream_t *)0x0) {
    return (quicly_stream_t *)0x0;
  }
  pqVar9->conn = conn;
  pqVar9->stream_id = stream_id;
  pqVar9->callbacks = (quicly_stream_callbacks_t *)0x0;
  pqVar9->data = (void *)0x0;
  h = conn->streams;
  if (h->upper_bound <= h->n_occupied) {
    uVar15 = h->n_buckets;
    if (h->size * 2 < uVar15) {
      kVar16 = uVar15 - 1;
    }
    else {
      kVar16 = uVar15 + 1;
    }
    iVar7 = kh_resize_quicly_stream_t(h,kVar16);
    if (iVar7 < 0) {
      kVar18 = h->n_buckets;
      goto LAB_00122a1c;
    }
  }
  kVar16 = h->n_buckets;
  kVar18 = ((uint)(stream_id >> 0x21) ^ (uint)stream_id << 0xb ^ (uint)stream_id) & kVar16 - 1;
  pkVar5 = h->flags;
  if ((pkVar5[kVar18 >> 4] >> ((char)kVar18 * '\x02' & 0x1fU) & 2) == 0) {
    iVar7 = 1;
    kVar14 = kVar16;
    uVar15 = kVar18;
    do {
      uVar17 = pkVar5[uVar15 >> 4];
      uVar13 = uVar15 * 2 & 0x1e;
      sVar11 = (sbyte)uVar13;
      uVar19 = uVar17 >> sVar11;
      if (((uVar19 & 2) != 0) || (((uVar19 & 1) == 0 && (h->keys[uVar15] == stream_id)))) {
        bVar21 = (uVar17 >> sVar11 & 2) == 0;
        goto LAB_001229a0;
      }
      if ((uVar17 >> uVar13 & 1) != 0) {
        kVar14 = uVar15;
      }
      uVar15 = uVar15 + iVar7 & kVar16 - 1;
      iVar7 = iVar7 + 1;
    } while (uVar15 != kVar18);
    bVar21 = true;
    bVar20 = kVar14 == kVar16;
    uVar15 = kVar18;
    kVar18 = kVar14;
    kVar14 = kVar16;
    if (bVar20) {
LAB_001229a0:
      if (kVar14 == kVar16) {
        kVar14 = uVar15;
      }
      kVar18 = kVar14;
      if (bVar21) {
        kVar18 = uVar15;
      }
    }
  }
  uVar17 = kVar18 >> 4;
  uVar15 = pkVar5[uVar17];
  bVar12 = (char)kVar18 * '\x02' & 0x1e;
  if ((uVar15 >> bVar12 & 2) == 0) {
    if ((uVar15 >> bVar12 & 1) != 0) {
      h->keys[kVar18] = stream_id;
      pkVar5[uVar17] = uVar15 & ~(3 << bVar12);
      h->size = h->size + 1;
    }
  }
  else {
    h->keys[kVar18] = stream_id;
    pkVar5[uVar17] = uVar15 & ~(3 << bVar12);
    uVar3 = h->size;
    uVar4 = h->n_occupied;
    h->size = uVar3 + 1;
    h->n_occupied = uVar4 + 1;
  }
LAB_00122a1c:
  if (kVar18 != conn->streams->n_buckets) {
    conn->streams->vals[kVar18] = pqVar9;
    uVar15 = ~(uint)(conn->super).local.bidi.next_stream_id & 1;
    iVar7 = quicly_stream_has_send_side(uVar15,stream_id);
    if (iVar7 == 0) {
      quicly_sendstate_init_closed(&pqVar9->sendstate);
    }
    else {
      quicly_sendstate_init(&pqVar9->sendstate);
    }
    iVar7 = quicly_stream_has_receive_side(uVar15,pqVar9->stream_id);
    if (iVar7 == 0) {
      quicly_recvstate_init_closed(&pqVar9->recvstate);
    }
    else {
      quicly_recvstate_init(&pqVar9->recvstate);
    }
    pqVar9->field_0xb8 = pqVar9->field_0xb8 & 0xfe;
    (pqVar9->_send_aux).max_stream_data = initial_max_stream_data_remote;
    (pqVar9->_send_aux).stop_sending.sender_state = QUICLY_SENDER_STATE_NONE;
    (pqVar9->_send_aux).stop_sending.error_code = 0;
    (pqVar9->_send_aux).reset_stream.sender_state = QUICLY_SENDER_STATE_NONE;
    (pqVar9->_send_aux).reset_stream.error_code = 0;
    (pqVar9->_send_aux).max_stream_data_sender.max_committed = (ulong)initial_max_stream_data_local;
    (pqVar9->_send_aux).max_stream_data_sender.max_acked = (ulong)initial_max_stream_data_local;
    (pqVar9->_send_aux).max_stream_data_sender.num_inflight = 0;
    puVar1 = &(pqVar9->_send_aux).max_stream_data_sender.field_0x18;
    *puVar1 = *puVar1 & 0xfe;
    (pqVar9->_send_aux).blocked = QUICLY_SENDER_STATE_NONE;
    paVar2 = &(pqVar9->_send_aux).pending_link;
    (pqVar9->_send_aux).pending_link.control.next = &paVar2->control;
    (pqVar9->_send_aux).pending_link.control.prev = &paVar2->control;
    pqVar10 = &(pqVar9->_send_aux).pending_link.default_scheduler;
    (pqVar9->_send_aux).pending_link.default_scheduler.next = pqVar10;
    (pqVar9->_send_aux).pending_link.default_scheduler.prev = pqVar10;
    (pqVar9->_recv_aux).window = initial_max_stream_data_local;
    pqVar6 = (pqVar9->conn->super).ctx;
    uVar17 = (int)(pqVar6->transport_params).max_streams_bidi +
             (int)(pqVar6->transport_params).max_streams_uni;
    uVar15 = initial_max_stream_data_local >> 10;
    if (initial_max_stream_data_local >> 10 < uVar17) {
      uVar15 = uVar17;
    }
    uVar8 = 0x3f;
    if (0x3f < uVar15) {
      uVar8 = uVar15;
    }
    (pqVar9->_recv_aux).max_ranges = uVar8;
    return pqVar9;
  }
  __assert_fail("iter != kh_end(conn->streams)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                ,0x42b,"quicly_stream_t *open_stream(quicly_conn_t *, uint64_t, uint32_t, uint64_t)"
               );
}

Assistant:

static quicly_stream_t *open_stream(quicly_conn_t *conn, uint64_t stream_id, uint32_t initial_max_stream_data_local,
                                    uint64_t initial_max_stream_data_remote)
{
    quicly_stream_t *stream;

    if ((stream = malloc(sizeof(*stream))) == NULL)
        return NULL;
    stream->conn = conn;
    stream->stream_id = stream_id;
    stream->callbacks = NULL;
    stream->data = NULL;

    int r;
    khiter_t iter = kh_put(quicly_stream_t, conn->streams, stream_id, &r);
    assert(iter != kh_end(conn->streams));
    kh_val(conn->streams, iter) = stream;

    init_stream_properties(stream, initial_max_stream_data_local, initial_max_stream_data_remote);

    return stream;
}